

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Cba_ManWriteFonRange(Cba_Ntk_t *p,int iFon)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Str_t *p_00;
  Vec_Str_t *vStr;
  int iFon_local;
  Cba_Ntk_t *p_local;
  
  p_00 = &p->pDesign->vOut;
  if (((iFon != 0) && (iVar1 = Cba_FonIsConst(iFon), iVar1 == 0)) &&
     ((iVar1 = Cba_FonRangeSize(p,iFon), iVar1 != 1 || (iVar1 = Cba_FonRight(p,iFon), iVar1 != 0))))
  {
    iVar1 = Cba_FonSigned(p,iFon);
    if (iVar1 != 0) {
      Vec_StrPrintF(p_00,"signed ");
    }
    uVar2 = Cba_FonLeft(p,iFon);
    uVar3 = Cba_FonRight(p,iFon);
    Vec_StrPrintF(p_00,"[%d:%d] ",(ulong)uVar2,(ulong)uVar3);
  }
  return;
}

Assistant:

void Cba_ManWriteFonRange( Cba_Ntk_t * p, int iFon )
{
    Vec_Str_t * vStr = &p->pDesign->vOut;
    if ( !iFon || Cba_FonIsConst(iFon) || (Cba_FonRangeSize(p, iFon) == 1 && Cba_FonRight(p, iFon) == 0) )
        return;
    if ( Cba_FonSigned(p, iFon) )
        Vec_StrPrintF( vStr, "signed " );
    Vec_StrPrintF( vStr, "[%d:%d] ", Cba_FonLeft(p, iFon), Cba_FonRight(p, iFon) );
}